

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

QString * vcCommandSeparator(void)

{
  DataPointer *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *this;
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&local_20,(Data *)0x0,
             L"&#x000D;&#x000A;if errorlevel 1 goto VCReportError&#x000D;&#x000A;",0x42);
  QString::QString((QString *)this,in_RDI);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString vcCommandSeparator()
{
    // MSVC transforms the build tree into a single batch file, simply pasting the contents
    // of the custom commands into it, and putting an "if errorlevel goto" statement behind it.
    // As we want every sub-command to be error-checked (as is done by makefile-based
    // backends), we insert the checks ourselves, using the undocumented jump target.
    return QStringLiteral("&#x000D;&#x000A;if errorlevel 1 goto VCReportError&#x000D;&#x000A;");
}